

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O0

bool ImNodes::GetNewConnection
               (void **input_node,char **input_slot_title,void **output_node,
               char **output_slot_title)

{
  long lVar1;
  bool bVar2;
  _CanvasStateImpl *impl;
  CanvasState *canvas;
  char **output_slot_title_local;
  void **output_node_local;
  char **input_slot_title_local;
  void **input_node_local;
  
  if (gCanvas == 0) {
    __assert_fail("gCanvas != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x229,
                  "bool ImNodes::GetNewConnection(void **, const char **, void **, const char **)");
  }
  if (input_node == (void **)0x0) {
    __assert_fail("input_node != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x22a,
                  "bool ImNodes::GetNewConnection(void **, const char **, void **, const char **)");
  }
  if (input_slot_title == (char **)0x0) {
    __assert_fail("input_slot_title != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x22b,
                  "bool ImNodes::GetNewConnection(void **, const char **, void **, const char **)");
  }
  if (output_node == (void **)0x0) {
    __assert_fail("output_node != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x22c,
                  "bool ImNodes::GetNewConnection(void **, const char **, void **, const char **)");
  }
  if (output_slot_title == (char **)0x0) {
    __assert_fail("output_slot_title != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x22d,
                  "bool ImNodes::GetNewConnection(void **, const char **, void **, const char **)");
  }
  lVar1 = *(long *)(gCanvas + 0x98);
  bVar2 = *(long *)(lVar1 + 0x50) != 0;
  if (bVar2) {
    *input_node = *(void **)(lVar1 + 0x40);
    *input_slot_title = *(char **)(lVar1 + 0x48);
    *output_node = *(void **)(lVar1 + 0x50);
    *output_slot_title = *(char **)(lVar1 + 0x58);
    memset((void *)(lVar1 + 0x40),0,0x20);
  }
  return bVar2;
}

Assistant:

bool GetNewConnection(void** input_node, const char** input_slot_title, void** output_node, const char** output_slot_title)
{
    assert(gCanvas != nullptr);
    assert(input_node != nullptr);
    assert(input_slot_title != nullptr);
    assert(output_node != nullptr);
    assert(output_slot_title != nullptr);

    auto* canvas = gCanvas;
    auto* impl = canvas->_impl;

    if (impl->new_connection.output_node != nullptr)
    {
        *input_node = impl->new_connection.input_node;
        *input_slot_title = impl->new_connection.input_slot;
        *output_node = impl->new_connection.output_node;
        *output_slot_title = impl->new_connection.output_slot;
        memset(&impl->new_connection, 0, sizeof(impl->new_connection));
        return true;
    }

    return false;
}